

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

void __thiscall helics::ActionMessage::ActionMessage(ActionMessage *this,ActionMessage *act)

{
  size_t size;
  SmallBuffer *pSVar1;
  int32_t iVar2;
  uint16_t uVar3;
  
  iVar2 = act->messageID;
  this->messageAction = act->messageAction;
  this->messageID = iVar2;
  (this->source_id).gid = (act->source_id).gid;
  (this->source_handle).hid = (act->source_handle).hid;
  (this->dest_id).gid = (act->dest_id).gid;
  (this->dest_handle).hid = (act->dest_handle).hid;
  uVar3 = act->flags;
  this->counter = act->counter;
  this->flags = uVar3;
  this->sequenceID = act->sequenceID;
  (this->actionTime).internalTimeCode = (act->actionTime).internalTimeCode;
  (this->Te).internalTimeCode = (act->Te).internalTimeCode;
  (this->Tdemin).internalTimeCode = (act->Tdemin).internalTimeCode;
  (this->Tso).internalTimeCode = (act->Tso).internalTimeCode;
  (this->payload).buffer._M_elems[0] = 0;
  (this->payload).buffer._M_elems[1] = 0;
  (this->payload).buffer._M_elems[2] = 0;
  (this->payload).buffer._M_elems[3] = 0;
  (this->payload).buffer._M_elems[4] = 0;
  (this->payload).buffer._M_elems[5] = 0;
  (this->payload).buffer._M_elems[6] = 0;
  (this->payload).buffer._M_elems[7] = 0;
  pSVar1 = &this->payload;
  (pSVar1->buffer)._M_elems[8] = 0;
  (pSVar1->buffer)._M_elems[9] = 0;
  (pSVar1->buffer)._M_elems[10] = 0;
  (pSVar1->buffer)._M_elems[0xb] = 0;
  (pSVar1->buffer)._M_elems[0xc] = 0;
  (pSVar1->buffer)._M_elems[0xd] = 0;
  (pSVar1->buffer)._M_elems[0xe] = 0;
  (pSVar1->buffer)._M_elems[0xf] = 0;
  pSVar1 = &this->payload;
  (pSVar1->buffer)._M_elems[0x10] = 0;
  (pSVar1->buffer)._M_elems[0x11] = 0;
  (pSVar1->buffer)._M_elems[0x12] = 0;
  (pSVar1->buffer)._M_elems[0x13] = 0;
  (pSVar1->buffer)._M_elems[0x14] = 0;
  (pSVar1->buffer)._M_elems[0x15] = 0;
  (pSVar1->buffer)._M_elems[0x16] = 0;
  (pSVar1->buffer)._M_elems[0x17] = 0;
  pSVar1 = &this->payload;
  (pSVar1->buffer)._M_elems[0x18] = 0;
  (pSVar1->buffer)._M_elems[0x19] = 0;
  (pSVar1->buffer)._M_elems[0x1a] = 0;
  (pSVar1->buffer)._M_elems[0x1b] = 0;
  (pSVar1->buffer)._M_elems[0x1c] = 0;
  (pSVar1->buffer)._M_elems[0x1d] = 0;
  (pSVar1->buffer)._M_elems[0x1e] = 0;
  (pSVar1->buffer)._M_elems[0x1f] = 0;
  pSVar1 = &this->payload;
  (pSVar1->buffer)._M_elems[0x20] = 0;
  (pSVar1->buffer)._M_elems[0x21] = 0;
  (pSVar1->buffer)._M_elems[0x22] = 0;
  (pSVar1->buffer)._M_elems[0x23] = 0;
  (pSVar1->buffer)._M_elems[0x24] = 0;
  (pSVar1->buffer)._M_elems[0x25] = 0;
  (pSVar1->buffer)._M_elems[0x26] = 0;
  (pSVar1->buffer)._M_elems[0x27] = 0;
  pSVar1 = &this->payload;
  (pSVar1->buffer)._M_elems[0x28] = 0;
  (pSVar1->buffer)._M_elems[0x29] = 0;
  (pSVar1->buffer)._M_elems[0x2a] = 0;
  (pSVar1->buffer)._M_elems[0x2b] = 0;
  (pSVar1->buffer)._M_elems[0x2c] = 0;
  (pSVar1->buffer)._M_elems[0x2d] = 0;
  (pSVar1->buffer)._M_elems[0x2e] = 0;
  (pSVar1->buffer)._M_elems[0x2f] = 0;
  pSVar1 = &this->payload;
  (pSVar1->buffer)._M_elems[0x30] = 0;
  (pSVar1->buffer)._M_elems[0x31] = 0;
  (pSVar1->buffer)._M_elems[0x32] = 0;
  (pSVar1->buffer)._M_elems[0x33] = 0;
  (pSVar1->buffer)._M_elems[0x34] = 0;
  (pSVar1->buffer)._M_elems[0x35] = 0;
  (pSVar1->buffer)._M_elems[0x36] = 0;
  (pSVar1->buffer)._M_elems[0x37] = 0;
  pSVar1 = &this->payload;
  (pSVar1->buffer)._M_elems[0x38] = 0;
  (pSVar1->buffer)._M_elems[0x39] = 0;
  (pSVar1->buffer)._M_elems[0x3a] = 0;
  (pSVar1->buffer)._M_elems[0x3b] = 0;
  (pSVar1->buffer)._M_elems[0x3c] = 0;
  (pSVar1->buffer)._M_elems[0x3d] = 0;
  (pSVar1->buffer)._M_elems[0x3e] = 0;
  (pSVar1->buffer)._M_elems[0x3f] = 0;
  (this->payload).bufferSize = 0;
  (this->payload).bufferCapacity = 0x40;
  (this->payload).heap = (byte *)&this->payload;
  (this->payload).nonOwning = false;
  (this->payload).locked = false;
  (this->payload).usingAllocatedBuffer = false;
  (this->payload).errorCondition = '\0';
  (this->payload).userKey = 0;
  size = (act->payload).bufferSize;
  SmallBuffer::reserve(&this->payload,size);
  (this->payload).bufferSize = size;
  memcpy((this->payload).heap,(act->payload).heap,(act->payload).bufferSize);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&this->stringData,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&act->stringData);
  return;
}

Assistant:

ActionMessage::ActionMessage(const ActionMessage& act):
    messageAction(act.messageAction), messageID(act.messageID), source_id(act.source_id),
    source_handle(act.source_handle), dest_id(act.dest_id), dest_handle(act.dest_handle),
    counter(act.counter), flags(act.flags), sequenceID(act.sequenceID), actionTime(act.actionTime),
    Te(act.Te), Tdemin(act.Tdemin), Tso(act.Tso), payload(act.payload), stringData(act.stringData)

{
}